

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O0

basic_ostream<char,_std::char_traits<char>_> *
math::wide_integer::operator<<
          (basic_ostream<char,_std::char_traits<char>_> *out,
          uintwide_t<24U,_unsigned_char,_void,_false> *x)

{
  char fill_char_str;
  fmtflags __a;
  _Ios_Fmtflags _Var1;
  unsigned_fast_type field_width_00;
  iterator str_result_00;
  pointer pcVar2;
  iterator str_result_01;
  pointer pcVar3;
  iterator str_result_02;
  pointer pcVar4;
  ostream *poVar5;
  bool show_pos_00;
  bool show_base_00;
  bool is_uppercase_00;
  string local_3d0 [39];
  value_type local_3a9;
  undefined1 auStack_3a8 [8];
  string_storage_hex_type str_result_2;
  undefined1 auStack_318 [8];
  string_storage_dec_type str_result_1;
  value_type local_269;
  undefined1 auStack_268 [8];
  string_storage_oct_type str_result;
  char fill_char_out;
  unsigned_fast_type field_width;
  uint_fast8_t base_rep;
  bool is_uppercase;
  bool show_base;
  bool show_pos;
  fmtflags my_flags;
  basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> ostr;
  uintwide_t<24U,_unsigned_char,_void,_false> *x_local;
  basic_ostream<char,_std::char_traits<char>_> *out_local;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&base_rep);
  __a = std::ios_base::flags((ios_base *)(out + *(long *)(*(long *)out + -0x18)));
  _Var1 = std::operator&(__a,_S_showpos);
  show_pos_00 = _Var1 == _S_showpos;
  _Var1 = std::operator&(__a,_S_showbase);
  show_base_00 = _Var1 == _S_showbase;
  _Var1 = std::operator&(__a,_S_uppercase);
  is_uppercase_00 = _Var1 == _S_uppercase;
  _Var1 = std::operator&(__a,_S_oct);
  if (_Var1 == _S_oct) {
    field_width._0_1_ = '\b';
  }
  else {
    _Var1 = std::operator&(__a,_S_hex);
    if (_Var1 == _S_hex) {
      field_width._0_1_ = '\x10';
    }
    else {
      field_width._0_1_ = '\n';
    }
  }
  field_width_00 = std::ios_base::width((ios_base *)(out + *(long *)(*(long *)out + -0x18)));
  fill_char_str = std::ios::fill();
  if ((char)field_width == '\b') {
    str_result.super_array<char,_179UL>.elems[0x98] = '\0';
    str_result.super_array<char,_179UL>.elems[0x99] = '\0';
    str_result.super_array<char,_179UL>.elems[0x9a] = '\0';
    str_result.super_array<char,_179UL>.elems[0x9b] = '\0';
    str_result.super_array<char,_179UL>.elems[0x9c] = '\0';
    str_result.super_array<char,_179UL>.elems[0x9d] = '\0';
    str_result.super_array<char,_179UL>.elems[0x9e] = '\0';
    str_result.super_array<char,_179UL>.elems[0x9f] = '\0';
    str_result.super_array<char,_179UL>.elems[0xa0] = '\0';
    str_result.super_array<char,_179UL>.elems[0xa1] = '\0';
    str_result.super_array<char,_179UL>.elems[0xa2] = '\0';
    str_result.super_array<char,_179UL>.elems[0xa3] = '\0';
    str_result.super_array<char,_179UL>.elems[0xa4] = '\0';
    str_result.super_array<char,_179UL>.elems[0xa5] = '\0';
    str_result.super_array<char,_179UL>.elems[0xa6] = '\0';
    str_result.super_array<char,_179UL>.elems[0x88] = '\0';
    str_result.super_array<char,_179UL>.elems[0x89] = '\0';
    str_result.super_array<char,_179UL>.elems[0x8a] = '\0';
    str_result.super_array<char,_179UL>.elems[0x8b] = '\0';
    str_result.super_array<char,_179UL>.elems[0x8c] = '\0';
    str_result.super_array<char,_179UL>.elems[0x8d] = '\0';
    str_result.super_array<char,_179UL>.elems[0x8e] = '\0';
    str_result.super_array<char,_179UL>.elems[0x8f] = '\0';
    str_result.super_array<char,_179UL>.elems[0x90] = '\0';
    str_result.super_array<char,_179UL>.elems[0x91] = '\0';
    str_result.super_array<char,_179UL>.elems[0x92] = '\0';
    str_result.super_array<char,_179UL>.elems[0x93] = '\0';
    str_result.super_array<char,_179UL>.elems[0x94] = '\0';
    str_result.super_array<char,_179UL>.elems[0x95] = '\0';
    str_result.super_array<char,_179UL>.elems[0x96] = '\0';
    str_result.super_array<char,_179UL>.elems[0x97] = '\0';
    str_result.super_array<char,_179UL>.elems[0x78] = '\0';
    str_result.super_array<char,_179UL>.elems[0x79] = '\0';
    str_result.super_array<char,_179UL>.elems[0x7a] = '\0';
    str_result.super_array<char,_179UL>.elems[0x7b] = '\0';
    str_result.super_array<char,_179UL>.elems[0x7c] = '\0';
    str_result.super_array<char,_179UL>.elems[0x7d] = '\0';
    str_result.super_array<char,_179UL>.elems[0x7e] = '\0';
    str_result.super_array<char,_179UL>.elems[0x7f] = '\0';
    str_result.super_array<char,_179UL>.elems[0x80] = '\0';
    str_result.super_array<char,_179UL>.elems[0x81] = '\0';
    str_result.super_array<char,_179UL>.elems[0x82] = '\0';
    str_result.super_array<char,_179UL>.elems[0x83] = '\0';
    str_result.super_array<char,_179UL>.elems[0x84] = '\0';
    str_result.super_array<char,_179UL>.elems[0x85] = '\0';
    str_result.super_array<char,_179UL>.elems[0x86] = '\0';
    str_result.super_array<char,_179UL>.elems[0x87] = '\0';
    str_result.super_array<char,_179UL>.elems[0x68] = '\0';
    str_result.super_array<char,_179UL>.elems[0x69] = '\0';
    str_result.super_array<char,_179UL>.elems[0x6a] = '\0';
    str_result.super_array<char,_179UL>.elems[0x6b] = '\0';
    str_result.super_array<char,_179UL>.elems[0x6c] = '\0';
    str_result.super_array<char,_179UL>.elems[0x6d] = '\0';
    str_result.super_array<char,_179UL>.elems[0x6e] = '\0';
    str_result.super_array<char,_179UL>.elems[0x6f] = '\0';
    str_result.super_array<char,_179UL>.elems[0x70] = '\0';
    str_result.super_array<char,_179UL>.elems[0x71] = '\0';
    str_result.super_array<char,_179UL>.elems[0x72] = '\0';
    str_result.super_array<char,_179UL>.elems[0x73] = '\0';
    str_result.super_array<char,_179UL>.elems[0x74] = '\0';
    str_result.super_array<char,_179UL>.elems[0x75] = '\0';
    str_result.super_array<char,_179UL>.elems[0x76] = '\0';
    str_result.super_array<char,_179UL>.elems[0x77] = '\0';
    str_result.super_array<char,_179UL>.elems[0x58] = '\0';
    str_result.super_array<char,_179UL>.elems[0x59] = '\0';
    str_result.super_array<char,_179UL>.elems[0x5a] = '\0';
    str_result.super_array<char,_179UL>.elems[0x5b] = '\0';
    str_result.super_array<char,_179UL>.elems[0x5c] = '\0';
    str_result.super_array<char,_179UL>.elems[0x5d] = '\0';
    str_result.super_array<char,_179UL>.elems[0x5e] = '\0';
    str_result.super_array<char,_179UL>.elems[0x5f] = '\0';
    str_result.super_array<char,_179UL>.elems[0x60] = '\0';
    str_result.super_array<char,_179UL>.elems[0x61] = '\0';
    str_result.super_array<char,_179UL>.elems[0x62] = '\0';
    str_result.super_array<char,_179UL>.elems[99] = '\0';
    str_result.super_array<char,_179UL>.elems[100] = '\0';
    str_result.super_array<char,_179UL>.elems[0x65] = '\0';
    str_result.super_array<char,_179UL>.elems[0x66] = '\0';
    str_result.super_array<char,_179UL>.elems[0x67] = '\0';
    str_result.super_array<char,_179UL>.elems[0x48] = '\0';
    str_result.super_array<char,_179UL>.elems[0x49] = '\0';
    str_result.super_array<char,_179UL>.elems[0x4a] = '\0';
    str_result.super_array<char,_179UL>.elems[0x4b] = '\0';
    str_result.super_array<char,_179UL>.elems[0x4c] = '\0';
    str_result.super_array<char,_179UL>.elems[0x4d] = '\0';
    str_result.super_array<char,_179UL>.elems[0x4e] = '\0';
    str_result.super_array<char,_179UL>.elems[0x4f] = '\0';
    str_result.super_array<char,_179UL>.elems[0x50] = '\0';
    str_result.super_array<char,_179UL>.elems[0x51] = '\0';
    str_result.super_array<char,_179UL>.elems[0x52] = '\0';
    str_result.super_array<char,_179UL>.elems[0x53] = '\0';
    str_result.super_array<char,_179UL>.elems[0x54] = '\0';
    str_result.super_array<char,_179UL>.elems[0x55] = '\0';
    str_result.super_array<char,_179UL>.elems[0x56] = '\0';
    str_result.super_array<char,_179UL>.elems[0x57] = '\0';
    str_result.super_array<char,_179UL>.elems[0x38] = '\0';
    str_result.super_array<char,_179UL>.elems[0x39] = '\0';
    str_result.super_array<char,_179UL>.elems[0x3a] = '\0';
    str_result.super_array<char,_179UL>.elems[0x3b] = '\0';
    str_result.super_array<char,_179UL>.elems[0x3c] = '\0';
    str_result.super_array<char,_179UL>.elems[0x3d] = '\0';
    str_result.super_array<char,_179UL>.elems[0x3e] = '\0';
    str_result.super_array<char,_179UL>.elems[0x3f] = '\0';
    str_result.super_array<char,_179UL>.elems[0x40] = '\0';
    str_result.super_array<char,_179UL>.elems[0x41] = '\0';
    str_result.super_array<char,_179UL>.elems[0x42] = '\0';
    str_result.super_array<char,_179UL>.elems[0x43] = '\0';
    str_result.super_array<char,_179UL>.elems[0x44] = '\0';
    str_result.super_array<char,_179UL>.elems[0x45] = '\0';
    str_result.super_array<char,_179UL>.elems[0x46] = '\0';
    str_result.super_array<char,_179UL>.elems[0x47] = '\0';
    str_result.super_array<char,_179UL>.elems[0x28] = '\0';
    str_result.super_array<char,_179UL>.elems[0x29] = '\0';
    str_result.super_array<char,_179UL>.elems[0x2a] = '\0';
    str_result.super_array<char,_179UL>.elems[0x2b] = '\0';
    str_result.super_array<char,_179UL>.elems[0x2c] = '\0';
    str_result.super_array<char,_179UL>.elems[0x2d] = '\0';
    str_result.super_array<char,_179UL>.elems[0x2e] = '\0';
    str_result.super_array<char,_179UL>.elems[0x2f] = '\0';
    str_result.super_array<char,_179UL>.elems[0x30] = '\0';
    str_result.super_array<char,_179UL>.elems[0x31] = '\0';
    str_result.super_array<char,_179UL>.elems[0x32] = '\0';
    str_result.super_array<char,_179UL>.elems[0x33] = '\0';
    str_result.super_array<char,_179UL>.elems[0x34] = '\0';
    str_result.super_array<char,_179UL>.elems[0x35] = '\0';
    str_result.super_array<char,_179UL>.elems[0x36] = '\0';
    str_result.super_array<char,_179UL>.elems[0x37] = '\0';
    str_result.super_array<char,_179UL>.elems[0x18] = '\0';
    str_result.super_array<char,_179UL>.elems[0x19] = '\0';
    str_result.super_array<char,_179UL>.elems[0x1a] = '\0';
    str_result.super_array<char,_179UL>.elems[0x1b] = '\0';
    str_result.super_array<char,_179UL>.elems[0x1c] = '\0';
    str_result.super_array<char,_179UL>.elems[0x1d] = '\0';
    str_result.super_array<char,_179UL>.elems[0x1e] = '\0';
    str_result.super_array<char,_179UL>.elems[0x1f] = '\0';
    str_result.super_array<char,_179UL>.elems[0x20] = '\0';
    str_result.super_array<char,_179UL>.elems[0x21] = '\0';
    str_result.super_array<char,_179UL>.elems[0x22] = '\0';
    str_result.super_array<char,_179UL>.elems[0x23] = '\0';
    str_result.super_array<char,_179UL>.elems[0x24] = '\0';
    str_result.super_array<char,_179UL>.elems[0x25] = '\0';
    str_result.super_array<char,_179UL>.elems[0x26] = '\0';
    str_result.super_array<char,_179UL>.elems[0x27] = '\0';
    str_result.super_array<char,_179UL>.elems[8] = '\0';
    str_result.super_array<char,_179UL>.elems[9] = '\0';
    str_result.super_array<char,_179UL>.elems[10] = '\0';
    str_result.super_array<char,_179UL>.elems[0xb] = '\0';
    str_result.super_array<char,_179UL>.elems[0xc] = '\0';
    str_result.super_array<char,_179UL>.elems[0xd] = '\0';
    str_result.super_array<char,_179UL>.elems[0xe] = '\0';
    str_result.super_array<char,_179UL>.elems[0xf] = '\0';
    str_result.super_array<char,_179UL>.elems[0x10] = '\0';
    str_result.super_array<char,_179UL>.elems[0x11] = '\0';
    str_result.super_array<char,_179UL>.elems[0x12] = '\0';
    str_result.super_array<char,_179UL>.elems[0x13] = '\0';
    str_result.super_array<char,_179UL>.elems[0x14] = '\0';
    str_result.super_array<char,_179UL>.elems[0x15] = '\0';
    str_result.super_array<char,_179UL>.elems[0x16] = '\0';
    str_result.super_array<char,_179UL>.elems[0x17] = '\0';
    auStack_268[0] = '\0';
    auStack_268[1] = '\0';
    auStack_268[2] = '\0';
    auStack_268[3] = '\0';
    auStack_268[4] = '\0';
    auStack_268[5] = '\0';
    auStack_268[6] = '\0';
    auStack_268[7] = '\0';
    str_result.super_array<char,_179UL>.elems[0] = '\0';
    str_result.super_array<char,_179UL>.elems[1] = '\0';
    str_result.super_array<char,_179UL>.elems[2] = '\0';
    str_result.super_array<char,_179UL>.elems[3] = '\0';
    str_result.super_array<char,_179UL>.elems[4] = '\0';
    str_result.super_array<char,_179UL>.elems[5] = '\0';
    str_result.super_array<char,_179UL>.elems[6] = '\0';
    str_result.super_array<char,_179UL>.elems[7] = '\0';
    str_result.super_array<char,_179UL>.elems[0xa7] = '\0';
    str_result.super_array<char,_179UL>.elems[0xa8] = '\0';
    str_result.super_array<char,_179UL>.elems[0xa9] = '\0';
    str_result.super_array<char,_179UL>.elems[0xaa] = '\0';
    detail::fixed_static_array<char,_179U>::fixed_static_array
              ((fixed_static_array<char,_179U> *)auStack_268);
    local_269 = '\0';
    detail::array_detail::array<char,_179UL>::fill((array<char,_179UL> *)auStack_268,&local_269);
    str_result_00 =
         detail::array_detail::array<char,_179UL>::begin((array<char,_179UL> *)auStack_268);
    uintwide_t<512u,unsigned_int,void,false>::wr_string<char*>
              ((uintwide_t<512u,unsigned_int,void,false> *)x,str_result_00,'\b',show_base_00,
               show_pos_00,is_uppercase_00,field_width_00,fill_char_str);
    pcVar2 = detail::array_detail::array<char,_179UL>::data((array<char,_179UL> *)auStack_268);
    std::operator<<((ostream *)&base_rep,pcVar2);
  }
  else if ((char)field_width == '\n') {
    str_result_1.super_array<char,_164UL>.elems[0x88] = '\0';
    str_result_1.super_array<char,_164UL>.elems[0x89] = '\0';
    str_result_1.super_array<char,_164UL>.elems[0x8a] = '\0';
    str_result_1.super_array<char,_164UL>.elems[0x8b] = '\0';
    str_result_1.super_array<char,_164UL>.elems[0x8c] = '\0';
    str_result_1.super_array<char,_164UL>.elems[0x8d] = '\0';
    str_result_1.super_array<char,_164UL>.elems[0x8e] = '\0';
    str_result_1.super_array<char,_164UL>.elems[0x8f] = '\0';
    str_result_1.super_array<char,_164UL>.elems[0x90] = '\0';
    str_result_1.super_array<char,_164UL>.elems[0x91] = '\0';
    str_result_1.super_array<char,_164UL>.elems[0x92] = '\0';
    str_result_1.super_array<char,_164UL>.elems[0x93] = '\0';
    str_result_1.super_array<char,_164UL>.elems[0x94] = '\0';
    str_result_1.super_array<char,_164UL>.elems[0x95] = '\0';
    str_result_1.super_array<char,_164UL>.elems[0x96] = '\0';
    str_result_1.super_array<char,_164UL>.elems[0x97] = '\0';
    str_result_1.super_array<char,_164UL>.elems[0x78] = '\0';
    str_result_1.super_array<char,_164UL>.elems[0x79] = '\0';
    str_result_1.super_array<char,_164UL>.elems[0x7a] = '\0';
    str_result_1.super_array<char,_164UL>.elems[0x7b] = '\0';
    str_result_1.super_array<char,_164UL>.elems[0x7c] = '\0';
    str_result_1.super_array<char,_164UL>.elems[0x7d] = '\0';
    str_result_1.super_array<char,_164UL>.elems[0x7e] = '\0';
    str_result_1.super_array<char,_164UL>.elems[0x7f] = '\0';
    str_result_1.super_array<char,_164UL>.elems[0x80] = '\0';
    str_result_1.super_array<char,_164UL>.elems[0x81] = '\0';
    str_result_1.super_array<char,_164UL>.elems[0x82] = '\0';
    str_result_1.super_array<char,_164UL>.elems[0x83] = '\0';
    str_result_1.super_array<char,_164UL>.elems[0x84] = '\0';
    str_result_1.super_array<char,_164UL>.elems[0x85] = '\0';
    str_result_1.super_array<char,_164UL>.elems[0x86] = '\0';
    str_result_1.super_array<char,_164UL>.elems[0x87] = '\0';
    str_result_1.super_array<char,_164UL>.elems[0x68] = '\0';
    str_result_1.super_array<char,_164UL>.elems[0x69] = '\0';
    str_result_1.super_array<char,_164UL>.elems[0x6a] = '\0';
    str_result_1.super_array<char,_164UL>.elems[0x6b] = '\0';
    str_result_1.super_array<char,_164UL>.elems[0x6c] = '\0';
    str_result_1.super_array<char,_164UL>.elems[0x6d] = '\0';
    str_result_1.super_array<char,_164UL>.elems[0x6e] = '\0';
    str_result_1.super_array<char,_164UL>.elems[0x6f] = '\0';
    str_result_1.super_array<char,_164UL>.elems[0x70] = '\0';
    str_result_1.super_array<char,_164UL>.elems[0x71] = '\0';
    str_result_1.super_array<char,_164UL>.elems[0x72] = '\0';
    str_result_1.super_array<char,_164UL>.elems[0x73] = '\0';
    str_result_1.super_array<char,_164UL>.elems[0x74] = '\0';
    str_result_1.super_array<char,_164UL>.elems[0x75] = '\0';
    str_result_1.super_array<char,_164UL>.elems[0x76] = '\0';
    str_result_1.super_array<char,_164UL>.elems[0x77] = '\0';
    str_result_1.super_array<char,_164UL>.elems[0x58] = '\0';
    str_result_1.super_array<char,_164UL>.elems[0x59] = '\0';
    str_result_1.super_array<char,_164UL>.elems[0x5a] = '\0';
    str_result_1.super_array<char,_164UL>.elems[0x5b] = '\0';
    str_result_1.super_array<char,_164UL>.elems[0x5c] = '\0';
    str_result_1.super_array<char,_164UL>.elems[0x5d] = '\0';
    str_result_1.super_array<char,_164UL>.elems[0x5e] = '\0';
    str_result_1.super_array<char,_164UL>.elems[0x5f] = '\0';
    str_result_1.super_array<char,_164UL>.elems[0x60] = '\0';
    str_result_1.super_array<char,_164UL>.elems[0x61] = '\0';
    str_result_1.super_array<char,_164UL>.elems[0x62] = '\0';
    str_result_1.super_array<char,_164UL>.elems[99] = '\0';
    str_result_1.super_array<char,_164UL>.elems[100] = '\0';
    str_result_1.super_array<char,_164UL>.elems[0x65] = '\0';
    str_result_1.super_array<char,_164UL>.elems[0x66] = '\0';
    str_result_1.super_array<char,_164UL>.elems[0x67] = '\0';
    str_result_1.super_array<char,_164UL>.elems[0x48] = '\0';
    str_result_1.super_array<char,_164UL>.elems[0x49] = '\0';
    str_result_1.super_array<char,_164UL>.elems[0x4a] = '\0';
    str_result_1.super_array<char,_164UL>.elems[0x4b] = '\0';
    str_result_1.super_array<char,_164UL>.elems[0x4c] = '\0';
    str_result_1.super_array<char,_164UL>.elems[0x4d] = '\0';
    str_result_1.super_array<char,_164UL>.elems[0x4e] = '\0';
    str_result_1.super_array<char,_164UL>.elems[0x4f] = '\0';
    str_result_1.super_array<char,_164UL>.elems[0x50] = '\0';
    str_result_1.super_array<char,_164UL>.elems[0x51] = '\0';
    str_result_1.super_array<char,_164UL>.elems[0x52] = '\0';
    str_result_1.super_array<char,_164UL>.elems[0x53] = '\0';
    str_result_1.super_array<char,_164UL>.elems[0x54] = '\0';
    str_result_1.super_array<char,_164UL>.elems[0x55] = '\0';
    str_result_1.super_array<char,_164UL>.elems[0x56] = '\0';
    str_result_1.super_array<char,_164UL>.elems[0x57] = '\0';
    str_result_1.super_array<char,_164UL>.elems[0x38] = '\0';
    str_result_1.super_array<char,_164UL>.elems[0x39] = '\0';
    str_result_1.super_array<char,_164UL>.elems[0x3a] = '\0';
    str_result_1.super_array<char,_164UL>.elems[0x3b] = '\0';
    str_result_1.super_array<char,_164UL>.elems[0x3c] = '\0';
    str_result_1.super_array<char,_164UL>.elems[0x3d] = '\0';
    str_result_1.super_array<char,_164UL>.elems[0x3e] = '\0';
    str_result_1.super_array<char,_164UL>.elems[0x3f] = '\0';
    str_result_1.super_array<char,_164UL>.elems[0x40] = '\0';
    str_result_1.super_array<char,_164UL>.elems[0x41] = '\0';
    str_result_1.super_array<char,_164UL>.elems[0x42] = '\0';
    str_result_1.super_array<char,_164UL>.elems[0x43] = '\0';
    str_result_1.super_array<char,_164UL>.elems[0x44] = '\0';
    str_result_1.super_array<char,_164UL>.elems[0x45] = '\0';
    str_result_1.super_array<char,_164UL>.elems[0x46] = '\0';
    str_result_1.super_array<char,_164UL>.elems[0x47] = '\0';
    str_result_1.super_array<char,_164UL>.elems[0x28] = '\0';
    str_result_1.super_array<char,_164UL>.elems[0x29] = '\0';
    str_result_1.super_array<char,_164UL>.elems[0x2a] = '\0';
    str_result_1.super_array<char,_164UL>.elems[0x2b] = '\0';
    str_result_1.super_array<char,_164UL>.elems[0x2c] = '\0';
    str_result_1.super_array<char,_164UL>.elems[0x2d] = '\0';
    str_result_1.super_array<char,_164UL>.elems[0x2e] = '\0';
    str_result_1.super_array<char,_164UL>.elems[0x2f] = '\0';
    str_result_1.super_array<char,_164UL>.elems[0x30] = '\0';
    str_result_1.super_array<char,_164UL>.elems[0x31] = '\0';
    str_result_1.super_array<char,_164UL>.elems[0x32] = '\0';
    str_result_1.super_array<char,_164UL>.elems[0x33] = '\0';
    str_result_1.super_array<char,_164UL>.elems[0x34] = '\0';
    str_result_1.super_array<char,_164UL>.elems[0x35] = '\0';
    str_result_1.super_array<char,_164UL>.elems[0x36] = '\0';
    str_result_1.super_array<char,_164UL>.elems[0x37] = '\0';
    str_result_1.super_array<char,_164UL>.elems[0x18] = '\0';
    str_result_1.super_array<char,_164UL>.elems[0x19] = '\0';
    str_result_1.super_array<char,_164UL>.elems[0x1a] = '\0';
    str_result_1.super_array<char,_164UL>.elems[0x1b] = '\0';
    str_result_1.super_array<char,_164UL>.elems[0x1c] = '\0';
    str_result_1.super_array<char,_164UL>.elems[0x1d] = '\0';
    str_result_1.super_array<char,_164UL>.elems[0x1e] = '\0';
    str_result_1.super_array<char,_164UL>.elems[0x1f] = '\0';
    str_result_1.super_array<char,_164UL>.elems[0x20] = '\0';
    str_result_1.super_array<char,_164UL>.elems[0x21] = '\0';
    str_result_1.super_array<char,_164UL>.elems[0x22] = '\0';
    str_result_1.super_array<char,_164UL>.elems[0x23] = '\0';
    str_result_1.super_array<char,_164UL>.elems[0x24] = '\0';
    str_result_1.super_array<char,_164UL>.elems[0x25] = '\0';
    str_result_1.super_array<char,_164UL>.elems[0x26] = '\0';
    str_result_1.super_array<char,_164UL>.elems[0x27] = '\0';
    str_result_1.super_array<char,_164UL>.elems[8] = '\0';
    str_result_1.super_array<char,_164UL>.elems[9] = '\0';
    str_result_1.super_array<char,_164UL>.elems[10] = '\0';
    str_result_1.super_array<char,_164UL>.elems[0xb] = '\0';
    str_result_1.super_array<char,_164UL>.elems[0xc] = '\0';
    str_result_1.super_array<char,_164UL>.elems[0xd] = '\0';
    str_result_1.super_array<char,_164UL>.elems[0xe] = '\0';
    str_result_1.super_array<char,_164UL>.elems[0xf] = '\0';
    str_result_1.super_array<char,_164UL>.elems[0x10] = '\0';
    str_result_1.super_array<char,_164UL>.elems[0x11] = '\0';
    str_result_1.super_array<char,_164UL>.elems[0x12] = '\0';
    str_result_1.super_array<char,_164UL>.elems[0x13] = '\0';
    str_result_1.super_array<char,_164UL>.elems[0x14] = '\0';
    str_result_1.super_array<char,_164UL>.elems[0x15] = '\0';
    str_result_1.super_array<char,_164UL>.elems[0x16] = '\0';
    str_result_1.super_array<char,_164UL>.elems[0x17] = '\0';
    auStack_318[0] = '\0';
    auStack_318[1] = '\0';
    auStack_318[2] = '\0';
    auStack_318[3] = '\0';
    auStack_318[4] = '\0';
    auStack_318[5] = '\0';
    auStack_318[6] = '\0';
    auStack_318[7] = '\0';
    str_result_1.super_array<char,_164UL>.elems[0] = '\0';
    str_result_1.super_array<char,_164UL>.elems[1] = '\0';
    str_result_1.super_array<char,_164UL>.elems[2] = '\0';
    str_result_1.super_array<char,_164UL>.elems[3] = '\0';
    str_result_1.super_array<char,_164UL>.elems[4] = '\0';
    str_result_1.super_array<char,_164UL>.elems[5] = '\0';
    str_result_1.super_array<char,_164UL>.elems[6] = '\0';
    str_result_1.super_array<char,_164UL>.elems[7] = '\0';
    str_result_1.super_array<char,_164UL>.elems[0x98] = '\0';
    str_result_1.super_array<char,_164UL>.elems[0x99] = '\0';
    str_result_1.super_array<char,_164UL>.elems[0x9a] = '\0';
    str_result_1.super_array<char,_164UL>.elems[0x9b] = '\0';
    detail::fixed_static_array<char,_164U>::fixed_static_array
              ((fixed_static_array<char,_164U> *)auStack_318);
    str_result_2.super_array<char,_136UL>.elems[0x87] = '\0';
    detail::array_detail::array<char,_164UL>::fill
              ((array<char,_164UL> *)auStack_318,str_result_2.super_array<char,_136UL>.elems + 0x87)
    ;
    str_result_01 =
         detail::array_detail::array<char,_164UL>::begin((array<char,_164UL> *)auStack_318);
    uintwide_t<512u,unsigned_int,void,false>::wr_string<char*>
              ((uintwide_t<512u,unsigned_int,void,false> *)x,str_result_01,'\n',show_base_00,
               show_pos_00,is_uppercase_00,field_width_00,fill_char_str);
    pcVar3 = detail::array_detail::array<char,_164UL>::data((array<char,_164UL> *)auStack_318);
    std::operator<<((ostream *)&base_rep,pcVar3);
  }
  else if ((char)field_width == '\x10') {
    str_result_2.super_array<char,_136UL>.elems[0x68] = '\0';
    str_result_2.super_array<char,_136UL>.elems[0x69] = '\0';
    str_result_2.super_array<char,_136UL>.elems[0x6a] = '\0';
    str_result_2.super_array<char,_136UL>.elems[0x6b] = '\0';
    str_result_2.super_array<char,_136UL>.elems[0x6c] = '\0';
    str_result_2.super_array<char,_136UL>.elems[0x6d] = '\0';
    str_result_2.super_array<char,_136UL>.elems[0x6e] = '\0';
    str_result_2.super_array<char,_136UL>.elems[0x6f] = '\0';
    str_result_2.super_array<char,_136UL>.elems[0x70] = '\0';
    str_result_2.super_array<char,_136UL>.elems[0x71] = '\0';
    str_result_2.super_array<char,_136UL>.elems[0x72] = '\0';
    str_result_2.super_array<char,_136UL>.elems[0x73] = '\0';
    str_result_2.super_array<char,_136UL>.elems[0x74] = '\0';
    str_result_2.super_array<char,_136UL>.elems[0x75] = '\0';
    str_result_2.super_array<char,_136UL>.elems[0x76] = '\0';
    str_result_2.super_array<char,_136UL>.elems[0x77] = '\0';
    str_result_2.super_array<char,_136UL>.elems[0x58] = '\0';
    str_result_2.super_array<char,_136UL>.elems[0x59] = '\0';
    str_result_2.super_array<char,_136UL>.elems[0x5a] = '\0';
    str_result_2.super_array<char,_136UL>.elems[0x5b] = '\0';
    str_result_2.super_array<char,_136UL>.elems[0x5c] = '\0';
    str_result_2.super_array<char,_136UL>.elems[0x5d] = '\0';
    str_result_2.super_array<char,_136UL>.elems[0x5e] = '\0';
    str_result_2.super_array<char,_136UL>.elems[0x5f] = '\0';
    str_result_2.super_array<char,_136UL>.elems[0x60] = '\0';
    str_result_2.super_array<char,_136UL>.elems[0x61] = '\0';
    str_result_2.super_array<char,_136UL>.elems[0x62] = '\0';
    str_result_2.super_array<char,_136UL>.elems[99] = '\0';
    str_result_2.super_array<char,_136UL>.elems[100] = '\0';
    str_result_2.super_array<char,_136UL>.elems[0x65] = '\0';
    str_result_2.super_array<char,_136UL>.elems[0x66] = '\0';
    str_result_2.super_array<char,_136UL>.elems[0x67] = '\0';
    str_result_2.super_array<char,_136UL>.elems[0x48] = '\0';
    str_result_2.super_array<char,_136UL>.elems[0x49] = '\0';
    str_result_2.super_array<char,_136UL>.elems[0x4a] = '\0';
    str_result_2.super_array<char,_136UL>.elems[0x4b] = '\0';
    str_result_2.super_array<char,_136UL>.elems[0x4c] = '\0';
    str_result_2.super_array<char,_136UL>.elems[0x4d] = '\0';
    str_result_2.super_array<char,_136UL>.elems[0x4e] = '\0';
    str_result_2.super_array<char,_136UL>.elems[0x4f] = '\0';
    str_result_2.super_array<char,_136UL>.elems[0x50] = '\0';
    str_result_2.super_array<char,_136UL>.elems[0x51] = '\0';
    str_result_2.super_array<char,_136UL>.elems[0x52] = '\0';
    str_result_2.super_array<char,_136UL>.elems[0x53] = '\0';
    str_result_2.super_array<char,_136UL>.elems[0x54] = '\0';
    str_result_2.super_array<char,_136UL>.elems[0x55] = '\0';
    str_result_2.super_array<char,_136UL>.elems[0x56] = '\0';
    str_result_2.super_array<char,_136UL>.elems[0x57] = '\0';
    str_result_2.super_array<char,_136UL>.elems[0x38] = '\0';
    str_result_2.super_array<char,_136UL>.elems[0x39] = '\0';
    str_result_2.super_array<char,_136UL>.elems[0x3a] = '\0';
    str_result_2.super_array<char,_136UL>.elems[0x3b] = '\0';
    str_result_2.super_array<char,_136UL>.elems[0x3c] = '\0';
    str_result_2.super_array<char,_136UL>.elems[0x3d] = '\0';
    str_result_2.super_array<char,_136UL>.elems[0x3e] = '\0';
    str_result_2.super_array<char,_136UL>.elems[0x3f] = '\0';
    str_result_2.super_array<char,_136UL>.elems[0x40] = '\0';
    str_result_2.super_array<char,_136UL>.elems[0x41] = '\0';
    str_result_2.super_array<char,_136UL>.elems[0x42] = '\0';
    str_result_2.super_array<char,_136UL>.elems[0x43] = '\0';
    str_result_2.super_array<char,_136UL>.elems[0x44] = '\0';
    str_result_2.super_array<char,_136UL>.elems[0x45] = '\0';
    str_result_2.super_array<char,_136UL>.elems[0x46] = '\0';
    str_result_2.super_array<char,_136UL>.elems[0x47] = '\0';
    str_result_2.super_array<char,_136UL>.elems[0x28] = '\0';
    str_result_2.super_array<char,_136UL>.elems[0x29] = '\0';
    str_result_2.super_array<char,_136UL>.elems[0x2a] = '\0';
    str_result_2.super_array<char,_136UL>.elems[0x2b] = '\0';
    str_result_2.super_array<char,_136UL>.elems[0x2c] = '\0';
    str_result_2.super_array<char,_136UL>.elems[0x2d] = '\0';
    str_result_2.super_array<char,_136UL>.elems[0x2e] = '\0';
    str_result_2.super_array<char,_136UL>.elems[0x2f] = '\0';
    str_result_2.super_array<char,_136UL>.elems[0x30] = '\0';
    str_result_2.super_array<char,_136UL>.elems[0x31] = '\0';
    str_result_2.super_array<char,_136UL>.elems[0x32] = '\0';
    str_result_2.super_array<char,_136UL>.elems[0x33] = '\0';
    str_result_2.super_array<char,_136UL>.elems[0x34] = '\0';
    str_result_2.super_array<char,_136UL>.elems[0x35] = '\0';
    str_result_2.super_array<char,_136UL>.elems[0x36] = '\0';
    str_result_2.super_array<char,_136UL>.elems[0x37] = '\0';
    str_result_2.super_array<char,_136UL>.elems[0x18] = '\0';
    str_result_2.super_array<char,_136UL>.elems[0x19] = '\0';
    str_result_2.super_array<char,_136UL>.elems[0x1a] = '\0';
    str_result_2.super_array<char,_136UL>.elems[0x1b] = '\0';
    str_result_2.super_array<char,_136UL>.elems[0x1c] = '\0';
    str_result_2.super_array<char,_136UL>.elems[0x1d] = '\0';
    str_result_2.super_array<char,_136UL>.elems[0x1e] = '\0';
    str_result_2.super_array<char,_136UL>.elems[0x1f] = '\0';
    str_result_2.super_array<char,_136UL>.elems[0x20] = '\0';
    str_result_2.super_array<char,_136UL>.elems[0x21] = '\0';
    str_result_2.super_array<char,_136UL>.elems[0x22] = '\0';
    str_result_2.super_array<char,_136UL>.elems[0x23] = '\0';
    str_result_2.super_array<char,_136UL>.elems[0x24] = '\0';
    str_result_2.super_array<char,_136UL>.elems[0x25] = '\0';
    str_result_2.super_array<char,_136UL>.elems[0x26] = '\0';
    str_result_2.super_array<char,_136UL>.elems[0x27] = '\0';
    str_result_2.super_array<char,_136UL>.elems[8] = '\0';
    str_result_2.super_array<char,_136UL>.elems[9] = '\0';
    str_result_2.super_array<char,_136UL>.elems[10] = '\0';
    str_result_2.super_array<char,_136UL>.elems[0xb] = '\0';
    str_result_2.super_array<char,_136UL>.elems[0xc] = '\0';
    str_result_2.super_array<char,_136UL>.elems[0xd] = '\0';
    str_result_2.super_array<char,_136UL>.elems[0xe] = '\0';
    str_result_2.super_array<char,_136UL>.elems[0xf] = '\0';
    str_result_2.super_array<char,_136UL>.elems[0x10] = '\0';
    str_result_2.super_array<char,_136UL>.elems[0x11] = '\0';
    str_result_2.super_array<char,_136UL>.elems[0x12] = '\0';
    str_result_2.super_array<char,_136UL>.elems[0x13] = '\0';
    str_result_2.super_array<char,_136UL>.elems[0x14] = '\0';
    str_result_2.super_array<char,_136UL>.elems[0x15] = '\0';
    str_result_2.super_array<char,_136UL>.elems[0x16] = '\0';
    str_result_2.super_array<char,_136UL>.elems[0x17] = '\0';
    auStack_3a8[0] = '\0';
    auStack_3a8[1] = '\0';
    auStack_3a8[2] = '\0';
    auStack_3a8[3] = '\0';
    auStack_3a8[4] = '\0';
    auStack_3a8[5] = '\0';
    auStack_3a8[6] = '\0';
    auStack_3a8[7] = '\0';
    str_result_2.super_array<char,_136UL>.elems[0] = '\0';
    str_result_2.super_array<char,_136UL>.elems[1] = '\0';
    str_result_2.super_array<char,_136UL>.elems[2] = '\0';
    str_result_2.super_array<char,_136UL>.elems[3] = '\0';
    str_result_2.super_array<char,_136UL>.elems[4] = '\0';
    str_result_2.super_array<char,_136UL>.elems[5] = '\0';
    str_result_2.super_array<char,_136UL>.elems[6] = '\0';
    str_result_2.super_array<char,_136UL>.elems[7] = '\0';
    str_result_2.super_array<char,_136UL>.elems[0x78] = '\0';
    str_result_2.super_array<char,_136UL>.elems[0x79] = '\0';
    str_result_2.super_array<char,_136UL>.elems[0x7a] = '\0';
    str_result_2.super_array<char,_136UL>.elems[0x7b] = '\0';
    str_result_2.super_array<char,_136UL>.elems[0x7c] = '\0';
    str_result_2.super_array<char,_136UL>.elems[0x7d] = '\0';
    str_result_2.super_array<char,_136UL>.elems[0x7e] = '\0';
    str_result_2.super_array<char,_136UL>.elems[0x7f] = '\0';
    detail::fixed_static_array<char,_136U>::fixed_static_array
              ((fixed_static_array<char,_136U> *)auStack_3a8);
    local_3a9 = '\0';
    detail::array_detail::array<char,_136UL>::fill((array<char,_136UL> *)auStack_3a8,&local_3a9);
    str_result_02 =
         detail::array_detail::array<char,_136UL>::begin((array<char,_136UL> *)auStack_3a8);
    uintwide_t<512u,unsigned_int,void,false>::wr_string<char*>
              ((uintwide_t<512u,unsigned_int,void,false> *)x,str_result_02,'\x10',show_base_00,
               show_pos_00,is_uppercase_00,field_width_00,fill_char_str);
    pcVar4 = detail::array_detail::array<char,_136UL>::data((array<char,_136UL> *)auStack_3a8);
    std::operator<<((ostream *)&base_rep,pcVar4);
  }
  std::__cxx11::ostringstream::str();
  poVar5 = std::operator<<(out,local_3d0);
  std::__cxx11::string::~string(local_3d0);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&base_rep);
  return poVar5;
}

Assistant:

auto operator<<(std::basic_ostream<char_type, traits_type>& out,
                  const uintwide_t<Width2, LimbType, AllocatorType, IsSigned>& x) -> std::basic_ostream<char_type, traits_type>&
  {
    std::basic_ostringstream<char_type, traits_type> ostr;

    const std::ios::fmtflags my_flags = out.flags();

    const auto show_pos     = ((my_flags & std::ios::showpos)   == std::ios::showpos);
    const auto show_base    = ((my_flags & std::ios::showbase)  == std::ios::showbase);
    const auto is_uppercase = ((my_flags & std::ios::uppercase) == std::ios::uppercase);

    auto base_rep = std::uint_fast8_t { };

    if     ((my_flags & std::ios::oct) == std::ios::oct) { base_rep = static_cast<std::uint_fast8_t>(UINT8_C( 8)); }
    else if((my_flags & std::ios::hex) == std::ios::hex) { base_rep = static_cast<std::uint_fast8_t>(UINT8_C(16)); }
    else                                                 { base_rep = static_cast<std::uint_fast8_t>(UINT8_C(10)); }

    const auto field_width   = static_cast<unsigned_fast_type>(out.width());
    const auto fill_char_out = static_cast<char>(out.fill());

    using local_wide_integer_type = uintwide_t<Width2, LimbType, AllocatorType, IsSigned>;

    if(base_rep == static_cast<std::uint_fast8_t>(UINT8_C(8)))
    {
      using string_storage_oct_type =
        std::conditional_t
          <local_wide_integer_type::my_width2 <= static_cast<size_t>(UINT32_C(2048)),
            detail::fixed_static_array <char,
                                        local_wide_integer_type::wr_string_max_buffer_size_oct()>,
            detail::fixed_dynamic_array<char,
                                        local_wide_integer_type::wr_string_max_buffer_size_oct(),
                                        typename std::allocator_traits<std::conditional_t<std::is_same<AllocatorType, void>::value,
                                                                                         std::allocator<void>,
                                                                                         AllocatorType>>::template rebind_alloc<typename local_wide_integer_type::limb_type>>>;

      // TBD: There is redundant storage of this kind both here
      // in this subroutine as well as in the wr_string method.
      string_storage_oct_type str_result { }; // LCOV_EXCL_LINE

      str_result.fill('\0');

      x.wr_string(str_result.begin(), base_rep, show_base, show_pos, is_uppercase, field_width, fill_char_out);

      static_cast<void>(ostr << str_result.data());
    }
    else if(base_rep == static_cast<std::uint_fast8_t>(UINT8_C(10)))
    {
      using string_storage_dec_type =
        std::conditional_t
          <local_wide_integer_type::my_width2 <= static_cast<size_t>(UINT32_C(2048)),
            detail::fixed_static_array <char,
                                        local_wide_integer_type::wr_string_max_buffer_size_dec()>,
            detail::fixed_dynamic_array<char,
                                        local_wide_integer_type::wr_string_max_buffer_size_dec(),
                                        typename std::allocator_traits<std::conditional_t<std::is_same<AllocatorType, void>::value,
                                                                                          std::allocator<void>,
                                                                                          AllocatorType>>::template rebind_alloc<typename local_wide_integer_type::limb_type>>>;

      // TBD: There is redundant storage of this kind both here
      // in this subroutine as well as in the wr_string method.
      string_storage_dec_type str_result { };

      str_result.fill('\0');

      x.wr_string(str_result.begin(), base_rep, show_base, show_pos, is_uppercase, field_width, fill_char_out);

      static_cast<void>(ostr << str_result.data());
    }
    else if(base_rep == static_cast<std::uint_fast8_t>(UINT8_C(16)))
    {
      using string_storage_hex_type =
        std::conditional_t
          <local_wide_integer_type::my_width2 <= static_cast<size_t>(UINT32_C(2048)),
            detail::fixed_static_array <char,
                                        local_wide_integer_type::wr_string_max_buffer_size_hex()>,
            detail::fixed_dynamic_array<char,
                                        local_wide_integer_type::wr_string_max_buffer_size_hex(),
                                        typename std::allocator_traits<std::conditional_t<std::is_same<AllocatorType, void>::value,
                                                                                         std::allocator<void>,
                                                                                         AllocatorType>>::template rebind_alloc<typename local_wide_integer_type::limb_type>>>;

      // TBD: There is redundant storage of this kind both here
      // in this subroutine as well as in the wr_string method.
      string_storage_hex_type str_result { };

      str_result.fill('\0');

      x.wr_string(str_result.begin(), base_rep, show_base, show_pos, is_uppercase, field_width, fill_char_out);

      static_cast<void>(ostr << str_result.data());
    }

    return (out << ostr.str());
  }